

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lennard.c
# Opt level: O2

void computeProperties(int natoms,double potentialEnergy,double *totalEnergy)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double vir;
  double kineticEnergy;
  double *local_68;
  double local_60;
  int ld;
  int hi;
  int lo;
  double *a;
  double *x;
  double *v;
  
  kineticEnergy = 0.0;
  vir = 0.0;
  local_68 = totalEnergy;
  local_60 = potentialEnergy;
  GA_Sync();
  NGA_Distribution(g_V,gMe,&lo,&hi);
  NGA_Access(g_V,&lo,&hi,&v,&ld);
  NGA_Access(g_X,&lo,&hi,&x,&ld);
  NGA_Access(g_G,&lo,&hi,&a,&ld);
  uVar1 = (long)((hi - lo) + 1) / 3;
  uVar3 = 0;
  uVar2 = uVar1 & 0xffffffff;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  dVar5 = 0.0;
  dVar6 = 0.0;
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      dVar6 = dVar6 + v[lVar4] * 0.5 * v[lVar4];
      dVar5 = dVar5 + x[lVar4] * a[lVar4];
      vir = dVar5;
      kineticEnergy = dVar6;
    }
    a = a + 3;
    x = x + 3;
    v = v + 3;
  }
  GA_Dgop(&kineticEnergy,1,"+");
  GA_Dgop(&vir,1,"+");
  dVar5 = kineticEnergy + local_60;
  *local_68 = dVar5;
  auVar7._0_8_ = kineticEnergy + kineticEnergy;
  auVar7._8_8_ = vir;
  auVar7 = divpd(auVar7,_DAT_001aa040);
  auVar8._8_8_ = (double)natoms;
  auVar8._0_8_ = (double)natoms;
  auVar8 = divpd(auVar7,auVar8);
  dVar6 = auVar8._0_8_;
  dVar9 = (auVar8._8_8_ + dVar6) * gDensity;
  measurementStep = measurementStep + 1;
  temperatureSum = temperatureSum + dVar6;
  temperatureSqdSum = dVar6 * dVar6 + temperatureSqdSum;
  pressureSum = pressureSum + dVar9;
  pressureSqdSum = dVar9 * dVar9 + pressureSqdSum;
  potentialEnergySum = potentialEnergySum + local_60;
  potentialEnergySqdSum = local_60 * local_60 + potentialEnergySqdSum;
  kineticEnergySum = kineticEnergy + kineticEnergySum;
  totalEnergySum = totalEnergySum + dVar5;
  totalEnergySqdSum = dVar5 * dVar5 + totalEnergySqdSum;
  return;
}

Assistant:

void computeProperties(int natoms, double potentialEnergy, 
               double *totalEnergy) {
  
  int i, p, lo, hi, ld, natms;
  double kineticEnergy = 0.0, vir = 0.0;
  double *v, *x, *a;
  
  GA_Sync();
  
  NGA_Distribution(g_V, gMe, &lo, &hi);
  NGA_Access(g_V, &lo, &hi, &v, &ld);
  NGA_Access(g_X, &lo, &hi, &x, &ld);
  NGA_Access(g_G, &lo, &hi, &a, &ld);
  
  natms = (hi-lo+1)/NDIM;
  for (p = 0; p < natms; p++)
    for (i = 0; i < NDIM; i++) {
      kineticEnergy += 0.5 * v[p*NDIM + i] * v[p*NDIM + i];
      vir += x[p*NDIM + i] * a[p*NDIM + i];
    }

  GA_Dgop(&kineticEnergy, 1, "+");
  GA_Dgop(&vir, 1, "+");
  (*totalEnergy) = kineticEnergy + potentialEnergy;

  temperature = 2.0 * kineticEnergy / 3.0 / natoms;
  pressure = temperature + vir / 3.0 / natoms;
  pressure *= gDensity;

  ++measurementStep;
  temperatureSum += temperature;
  temperatureSqdSum += temperature * temperature;
  pressureSum += pressure;
  pressureSqdSum += pressure * pressure;
  potentialEnergySum += potentialEnergy;
  potentialEnergySqdSum += potentialEnergy * potentialEnergy;

  /* for checking the fluctuation */
  kineticEnergySum += kineticEnergy;
  totalEnergySum   += (*totalEnergy);
  totalEnergySqdSum += (*totalEnergy)*(*totalEnergy);
}